

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O1

void deqp::gls::ub::anon_unknown_12::generateCompareFuncs(ostream *str,ShaderInterface *interface)

{
  _Rb_tree_header *p_Var1;
  UniformBlock *pUVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  ostream *poVar5;
  int iVar6;
  pointer ppUVar7;
  _Base_ptr p_Var8;
  size_t sVar9;
  _Rb_tree_header *p_Var10;
  pointer pUVar11;
  long lVar12;
  char *__s;
  int type;
  set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> types;
  set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> compareFuncs;
  DataType local_a0;
  _Rb_tree_color local_9c;
  ostream *local_98;
  _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
  local_90;
  _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
  local_60;
  
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppUVar7 = (interface->m_uniformBlocks).
            super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_98 = str;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (0 < (int)((ulong)((long)(interface->m_uniformBlocks).
                              super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppUVar7) >> 3)) {
    lVar12 = 0;
    do {
      pUVar2 = ppUVar7[lVar12];
      for (pUVar11 = (pUVar2->m_uniforms).
                     super__Vector_base<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pUVar11 !=
          *(pointer *)
           ((long)&(pUVar2->m_uniforms).
                   super__Vector_base<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>
                   ._M_impl + 8); pUVar11 = pUVar11 + 1) {
        collectUniqueBasicTypes
                  ((set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> *)
                   &local_90,&pUVar11->m_type);
      }
      lVar12 = lVar12 + 1;
      ppUVar7 = (interface->m_uniformBlocks).
                super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar12 < (int)((ulong)((long)(interface->m_uniformBlocks).
                                          super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppUVar7
                                   ) >> 3));
  }
  p_Var10 = &local_90._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left != p_Var10) {
    p_Var8 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_9c = p_Var8[1]._M_color;
      if (local_9c - 5 < 9) {
        local_a0 = TYPE_FLOAT;
        std::
        _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
        ::_M_insert_unique<glu::DataType>(&local_60,&local_a0);
        iVar6 = glu::getDataTypeMatrixNumRows(local_9c);
        local_a0 = glu::getDataTypeFloatVec(iVar6);
        std::
        _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
        ::_M_insert_unique<glu::DataType>(&local_60,&local_a0);
      }
      else if (local_9c + ~_S_black < 3) {
        local_a0 = TYPE_FLOAT;
        std::
        _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
        ::_M_insert_unique<glu::DataType>(&local_60,&local_a0);
      }
      std::
      _Rb_tree<glu::DataType,glu::DataType,std::_Identity<glu::DataType>,std::less<glu::DataType>,std::allocator<glu::DataType>>
      ::_M_insert_unique<glu::DataType_const&>
                ((_Rb_tree<glu::DataType,glu::DataType,std::_Identity<glu::DataType>,std::less<glu::DataType>,std::allocator<glu::DataType>>
                  *)&local_60,&local_9c);
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var10);
  }
  poVar5 = local_98;
  iVar6 = 0;
  p_Var8 = &p_Var1->_M_header;
  p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
  do {
    for (; (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
        p_Var4 = (&p_Var4->_M_left)[(int)*(size_t *)(p_Var4 + 1) < iVar6]) {
      if (iVar6 <= (int)*(size_t *)(p_Var4 + 1)) {
        p_Var8 = p_Var4;
      }
    }
    p_Var10 = p_Var1;
    if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
       (p_Var10 = (_Rb_tree_header *)p_Var8, iVar6 < (int)((_Rb_tree_header *)p_Var8)->_M_node_count
       )) {
      p_Var10 = p_Var1;
    }
    if (p_Var10 == p_Var1) goto LAB_00801ec2;
    switch(iVar6) {
    case 1:
      bVar3 = false;
      __s = 
      "mediump float compare_float    (highp float a, highp float b)  { return abs(a - b) < 0.05 ? 1.0 : 0.0; }\n"
      ;
      goto LAB_00801e8f;
    case 2:
      __s = 
      "mediump float compare_vec2     (highp vec2 a, highp vec2 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y); }\n"
      ;
      break;
    case 3:
      __s = 
      "mediump float compare_vec3     (highp vec3 a, highp vec3 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z); }\n"
      ;
      break;
    case 4:
      __s = 
      "mediump float compare_vec4     (highp vec4 a, highp vec4 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z)*compare_float(a.w, b.w); }\n"
      ;
      break;
    case 5:
      __s = 
      "mediump float compare_mat2     (highp mat2 a, highp mat2 b)    { return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1]); }\n"
      ;
      break;
    case 6:
      __s = 
      "mediump float compare_mat2x3   (highp mat2x3 a, highp mat2x3 b){ return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1]); }\n"
      ;
      break;
    case 7:
      __s = 
      "mediump float compare_mat2x4   (highp mat2x4 a, highp mat2x4 b){ return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1]); }\n"
      ;
      break;
    case 8:
      __s = 
      "mediump float compare_mat3x2   (highp mat3x2 a, highp mat3x2 b){ return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1])*compare_vec2(a[2], b[2]); }\n"
      ;
      break;
    case 9:
      __s = 
      "mediump float compare_mat3     (highp mat3 a, highp mat3 b)    { return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2]); }\n"
      ;
      break;
    case 10:
      __s = 
      "mediump float compare_mat3x4   (highp mat3x4 a, highp mat3x4 b){ return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2]); }\n"
      ;
      break;
    case 0xb:
      __s = 
      "mediump float compare_mat4x2   (highp mat4x2 a, highp mat4x2 b){ return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1])*compare_vec2(a[2], b[2])*compare_vec2(a[3], b[3]); }\n"
      ;
      break;
    case 0xc:
      __s = 
      "mediump float compare_mat4x3   (highp mat4x3 a, highp mat4x3 b){ return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2])*compare_vec3(a[3], b[3]); }\n"
      ;
      break;
    case 0xd:
      __s = 
      "mediump float compare_mat4     (highp mat4 a, highp mat4 b)    { return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2])*compare_vec4(a[3], b[3]); }\n"
      ;
      break;
    default:
      bVar3 = true;
      __s = (char *)0x0;
      goto LAB_00801e8f;
    case 0x1b:
      __s = 
      "mediump float compare_int      (highp int a, highp int b)      { return a == b ? 1.0 : 0.0; }\n"
      ;
      break;
    case 0x1c:
      __s = 
      "mediump float compare_ivec2    (highp ivec2 a, highp ivec2 b)  { return a == b ? 1.0 : 0.0; }\n"
      ;
      break;
    case 0x1d:
      __s = 
      "mediump float compare_ivec3    (highp ivec3 a, highp ivec3 b)  { return a == b ? 1.0 : 0.0; }\n"
      ;
      break;
    case 0x1e:
      __s = 
      "mediump float compare_ivec4    (highp ivec4 a, highp ivec4 b)  { return a == b ? 1.0 : 0.0; }\n"
      ;
      break;
    case 0x1f:
      __s = 
      "mediump float compare_uint     (highp uint a, highp uint b)    { return a == b ? 1.0 : 0.0; }\n"
      ;
      break;
    case 0x20:
      __s = 
      "mediump float compare_uvec2    (highp uvec2 a, highp uvec2 b)  { return a == b ? 1.0 : 0.0; }\n"
      ;
      break;
    case 0x21:
      __s = 
      "mediump float compare_uvec3    (highp uvec3 a, highp uvec3 b)  { return a == b ? 1.0 : 0.0; }\n"
      ;
      break;
    case 0x22:
      __s = 
      "mediump float compare_uvec4    (highp uvec4 a, highp uvec4 b)  { return a == b ? 1.0 : 0.0; }\n"
      ;
      break;
    case 0x23:
      __s = 
      "mediump float compare_bool     (bool a, bool b)                { return a == b ? 1.0 : 0.0; }\n"
      ;
      break;
    case 0x24:
      __s = 
      "mediump float compare_bvec2    (bvec2 a, bvec2 b)              { return a == b ? 1.0 : 0.0; }\n"
      ;
      break;
    case 0x25:
      __s = 
      "mediump float compare_bvec3    (bvec3 a, bvec3 b)              { return a == b ? 1.0 : 0.0; }\n"
      ;
      break;
    case 0x26:
      __s = 
      "mediump float compare_bvec4    (bvec4 a, bvec4 b)              { return a == b ? 1.0 : 0.0; }\n"
      ;
    }
    bVar3 = false;
LAB_00801e8f:
    if (bVar3) {
      std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
    }
    else {
      sVar9 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar9);
    }
LAB_00801ec2:
    iVar6 = iVar6 + 1;
    p_Var8 = &p_Var1->_M_header;
    p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (iVar6 == 0x5e) {
      std::
      _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
      ::~_Rb_tree(&local_60);
      std::
      _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
      ::~_Rb_tree(&local_90);
      return;
    }
  } while( true );
}

Assistant:

void generateCompareFuncs (std::ostream& str, const ShaderInterface& interface)
{
	std::set<glu::DataType> types;
	std::set<glu::DataType> compareFuncs;

	// Collect unique basic types
	collectUniqueBasicTypes(types, interface);

	// Set of compare functions required
	for (std::set<glu::DataType>::const_iterator iter = types.begin(); iter != types.end(); ++iter)
	{
		getCompareDependencies(compareFuncs, *iter);
	}

	for (int type = 0; type < glu::TYPE_LAST; ++type)
	{
		if (compareFuncs.find(glu::DataType(type)) != compareFuncs.end())
			str << getCompareFuncForType(glu::DataType(type));
	}
}